

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shape.cpp
# Opt level: O3

Interaction * __thiscall
phyr::Shape::sample(Interaction *__return_storage_ptr__,Shape *this,Interaction *ref,Point2f *u,
                   double *pdf)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  (*this->_vptr_Shape[7])(__return_storage_ptr__,this,u,pdf);
  dVar4 = (__return_storage_ptr__->p).x;
  dVar1 = (__return_storage_ptr__->p).y;
  dVar5 = (ref->p).x;
  dVar9 = (ref->p).y;
  dVar6 = dVar4 - dVar5;
  dVar7 = dVar1 - dVar9;
  dVar2 = (__return_storage_ptr__->p).z;
  dVar3 = (ref->p).z;
  dVar8 = dVar2 - dVar3;
  dVar10 = dVar8 * dVar8 + dVar6 * dVar6 + dVar7 * dVar7;
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    dVar10 = 1.0 / SQRT(dVar10);
    dVar5 = dVar5 - dVar4;
    dVar9 = dVar9 - dVar1;
    dVar3 = dVar3 - dVar2;
    dVar4 = ((dVar3 * dVar3 + dVar5 * dVar5 + dVar9 * dVar9) /
            ABS((-dVar6 * dVar10 * (__return_storage_ptr__->n).x -
                dVar7 * dVar10 * (__return_storage_ptr__->n).y) -
                dVar10 * dVar8 * (__return_storage_ptr__->n).z)) * *pdf;
    if (ABS(dVar4) != INFINITY) goto LAB_0013856b;
  }
  dVar4 = 0.0;
LAB_0013856b:
  *pdf = dVar4;
  return __return_storage_ptr__;
}

Assistant:

Interaction Shape::sample(const Interaction& ref, const Point2f& u,
                          Real* pdf) const {
    Interaction intr = sample(u, pdf);
    Vector3f wi = intr.p - ref.p;
    if (wi.lengthSquared() == 0)
        *pdf = 0;
    else {
        wi = normalize(wi);
        // Convert from area measure, as returned by the Sample() call
        // above, to solid angle measure.
        *pdf *= distanceSquared(ref.p, intr.p) / absDot(intr.n, -wi);
        if (std::isinf(*pdf)) *pdf = 0.f;
    }
    return intr;
}